

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

void rhash_free(rhash ctx)

{
  code *pcVar1;
  uint uVar2;
  rhash prVar3;
  ulong uVar4;
  
  if (ctx == (rhash)0x0) {
    return;
  }
  uVar2 = (uint)ctx[1].msg_size;
  if (uVar2 < 0xb) {
    ctx[1].hash_id = 0xdecea5ed;
    if (uVar2 != 0) {
      prVar3 = ctx + 4;
      uVar4 = 0;
      do {
        pcVar1 = *(code **)(*(long *)&prVar3[-1].hash_id + 0x30);
        if (pcVar1 != (code *)0x0) {
          (*pcVar1)(prVar3->msg_size);
          uVar2 = (uint)ctx[1].msg_size;
        }
        uVar4 = uVar4 + 1;
        prVar3 = prVar3 + 1;
      } while (uVar4 < uVar2);
    }
    free(ctx);
    return;
  }
  __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                ,0xb8,"void rhash_free(rhash)");
}

Assistant:

void rhash_free(rhash ctx)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	if (ctx == 0) return;
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);
	ectx->state = STATE_DELETED; /* mark memory block as being removed */

	/* clean the hash functions, which require additional clean up */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		if (info->cleanup != 0) {
			info->cleanup(ectx->vector[i].context);
		}
	}

	free(ectx);
}